

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
                    sqlite3_value **argv)

{
  long lVar1;
  uint uVar2;
  char *pcVar3;
  int in_ECX;
  long *in_RDI;
  long in_FS_OFFSET;
  char *zText;
  char *zSql;
  int j;
  int i;
  int rc;
  PragmaVtab *pTab;
  PragmaVtabCursor *pCsr;
  StrAccum acc;
  StrAccum *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  sqlite3 *in_stack_ffffffffffffff78;
  sqlite3_str *p;
  undefined4 in_stack_ffffffffffffff88;
  int iVar4;
  undefined4 uVar5;
  int local_2c;
  undefined1 local_28 [24];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *in_RDI;
  uVar5 = 0xaaaaaaaa;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  p = (sqlite3_str *)&DAT_aaaaaaaaaaaaaaaa;
  pragmaVtabCursorClear
            ((PragmaVtabCursor *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  uVar2 = (uint)((*(byte *)(*(long *)(lVar1 + 0x20) + 9) & 0x20) == 0);
  iVar4 = 0;
  do {
    if (in_ECX <= iVar4) {
      sqlite3StrAccumInit((StrAccum *)local_28,(sqlite3 *)0x0,(char *)0x0,0,
                          *(int *)(*(long *)(lVar1 + 0x18) + 0x8c));
      sqlite3_str_appendall(p,(char *)in_stack_ffffffffffffff78);
      if (in_RDI[4] != 0) {
        sqlite3_str_appendf((StrAccum *)local_28,"%Q.",in_RDI[4]);
      }
      sqlite3_str_appendall(p,(char *)in_stack_ffffffffffffff78);
      if (in_RDI[3] != 0) {
        sqlite3_str_appendf((StrAccum *)local_28,"=%Q",in_RDI[3]);
      }
      pcVar3 = sqlite3StrAccumFinish(in_stack_ffffffffffffff68);
      if (pcVar3 == (char *)0x0) {
        local_2c = 7;
      }
      else {
        local_2c = sqlite3_prepare_v2((sqlite3 *)CONCAT44(uVar5,iVar4),
                                      (char *)CONCAT44(uVar2,in_stack_ffffffffffffff88),
                                      (int)((ulong)pcVar3 >> 0x20),
                                      (sqlite3_stmt **)in_stack_ffffffffffffff78,
                                      (char **)CONCAT44(in_stack_ffffffffffffff74,
                                                        in_stack_ffffffffffffff70));
        sqlite3_free((void *)0x1a360a);
        if (local_2c == 0) {
          local_2c = pragmaVtabNext((sqlite3_vtab_cursor *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        }
        else {
          pcVar3 = sqlite3_errmsg(in_stack_ffffffffffffff78);
          pcVar3 = sqlite3_mprintf("%s",pcVar3);
          *(char **)(lVar1 + 0x10) = pcVar3;
        }
      }
LAB_001a3654:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_2c;
      }
      __stack_chk_fail();
    }
    in_stack_ffffffffffffff78 = (sqlite3 *)sqlite3_value_text((sqlite3_value *)0x1a34ab);
    if (in_stack_ffffffffffffff78 != (sqlite3 *)0x0) {
      pcVar3 = sqlite3_mprintf("%s",in_stack_ffffffffffffff78);
      in_RDI[(long)(int)uVar2 + 3] = (long)pcVar3;
      if (in_RDI[(long)(int)uVar2 + 3] == 0) {
        local_2c = 7;
        goto LAB_001a3654;
      }
    }
    iVar4 = iVar4 + 1;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static int pragmaVtabFilter(
  sqlite3_vtab_cursor *pVtabCursor,
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  PragmaVtabCursor *pCsr = (PragmaVtabCursor*)pVtabCursor;
  PragmaVtab *pTab = (PragmaVtab*)(pVtabCursor->pVtab);
  int rc;
  int i, j;
  StrAccum acc;
  char *zSql;

  UNUSED_PARAMETER(idxNum);
  UNUSED_PARAMETER(idxStr);
  pragmaVtabCursorClear(pCsr);
  j = (pTab->pName->mPragFlg & PragFlg_Result1)!=0 ? 0 : 1;
  for(i=0; i<argc; i++, j++){
    const char *zText = (const char*)sqlite3_value_text(argv[i]);
    assert( j<ArraySize(pCsr->azArg) );
    assert( pCsr->azArg[j]==0 );
    if( zText ){
      pCsr->azArg[j] = sqlite3_mprintf("%s", zText);
      if( pCsr->azArg[j]==0 ){
        return SQLITE_NOMEM;
      }
    }
  }
  sqlite3StrAccumInit(&acc, 0, 0, 0, pTab->db->aLimit[SQLITE_LIMIT_SQL_LENGTH]);
  sqlite3_str_appendall(&acc, "PRAGMA ");
  if( pCsr->azArg[1] ){
    sqlite3_str_appendf(&acc, "%Q.", pCsr->azArg[1]);
  }
  sqlite3_str_appendall(&acc, pTab->pName->zName);
  if( pCsr->azArg[0] ){
    sqlite3_str_appendf(&acc, "=%Q", pCsr->azArg[0]);
  }
  zSql = sqlite3StrAccumFinish(&acc);
  if( zSql==0 ) return SQLITE_NOMEM;
  rc = sqlite3_prepare_v2(pTab->db, zSql, -1, &pCsr->pPragma, 0);
  sqlite3_free(zSql);
  if( rc!=SQLITE_OK ){
    pTab->base.zErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pTab->db));
    return rc;
  }
  return pragmaVtabNext(pVtabCursor);
}